

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabel::paintEvent(QLabel *this,QPaintEvent *param_1)

{
  optional<QPicture> *this_00;
  State *this_01;
  uint uVar1;
  long lVar2;
  QLabelPrivate *this_02;
  undefined1 *puVar3;
  undefined1 *puVar4;
  bool bVar5;
  char cVar6;
  LayoutDirection LVar7;
  Alignment AVar8;
  ColorRole CVar9;
  QObject *object;
  QStyleSheetStyle *this_03;
  QColor *acolor;
  QPicture *pQVar10;
  QIcon *pQVar11;
  QSize QVar12;
  QSize QVar13;
  long lVar14;
  QStyleOption *this_04;
  int iVar15;
  undefined8 *puVar16;
  PaintContext *pPVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long in_FS_OFFSET;
  byte bVar23;
  double dVar24;
  QRect QVar25;
  undefined1 auVar26 [16];
  QSize local_130;
  undefined1 local_128 [8];
  undefined1 *puStack_120;
  undefined1 *local_118;
  qreal qStack_110;
  QRectF local_108;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  QPainter painter;
  QStyleOption opt;
  QStyleOption opt_1;
  
  bVar23 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  object = &QWidget::style((QWidget *)this)->super_QObject;
  _painter = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&painter,&(this->super_QFrame).super_QWidget.super_QPaintDevice);
  QFrame::drawFrame(&this->super_QFrame,&painter);
  QVar25 = QWidget::contentsRect((QWidget *)this);
  local_d4 = this_02->margin;
  local_e0 = QVar25.x1.m_i.m_i + local_d4;
  local_dc = QVar25.y1.m_i.m_i + local_d4;
  local_d8 = QVar25.x2.m_i.m_i - local_d4;
  local_d4 = QVar25.y2.m_i.m_i - local_d4;
  if ((this_02->field_0x340 & 0x10) == 0) {
    LVar7 = QWidget::layoutDirection((QWidget *)this);
  }
  else {
    LVar7 = QLabelPrivate::textDirection(this_02);
  }
  AVar8 = QStyle::visualAlignment(LVar7,(Alignment)this_02->align);
  bVar5 = QPointer::operator_cast_to_bool((QPointer *)&this_02->movie);
  if (bVar5) {
    QMovie::currentPixmap();
    cVar6 = QPixmap::isNull();
    QPixmap::~QPixmap((QPixmap *)&opt);
    if (cVar6 != '\0') goto LAB_003e4a6f;
    if ((this_02->field_0x340 & 2) == 0) {
      this_04 = &opt;
      QMovie::currentPixmap();
      (**(code **)(*(long *)object + 0xa0))
                (object,&painter,&local_e0,
                 AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i,this_04);
    }
    else {
      this_04 = &opt_1;
      QMovie::currentPixmap();
      local_108.xp._0_4_ = (local_d8 - local_e0) + 1;
      local_108.xp._4_4_ = (local_d4 - local_dc) + 1;
      QPixmap::scaled((QSize *)&opt,(AspectRatioMode)this_04,(TransformationMode)&local_108);
      (**(code **)(*(long *)object + 0xa0))
                (object,&painter,&local_e0,
                 AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i,&opt);
      QPixmap::~QPixmap((QPixmap *)&opt);
    }
  }
  else {
LAB_003e4a6f:
    if ((this_02->field_0x340 & 0x10) != 0) {
      QLabelPrivate::layoutRect((QRectF *)&opt,this_02);
      auVar26 = QRectF::toAlignedRect();
      QVar12 = (QSize)(double)auVar26._0_4_;
      puVar3 = (undefined1 *)(double)auVar26._4_4_;
      puVar4 = (undefined1 *)(double)(((long)auVar26._8_4_ - (long)auVar26._0_4_) + 1);
      dVar24 = (double)(((auVar26._8_8_ >> 0x20) - (auVar26._0_8_ >> 0x20)) + 1);
      opt_1.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt_1.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt_1._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt_1.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt_1.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt_1.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt_1._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt_1._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108.xp = (qreal)QVar12;
      local_108.yp = (qreal)puVar3;
      local_108.w = (qreal)puVar4;
      local_108.h = dVar24;
      QStyleOption::QStyleOption(&opt_1,1,0);
      QStyleOption::initFrom(&opt_1,(QWidget *)this);
      this_03 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(object);
      if (this_03 != (QStyleSheetStyle *)0x0) {
        QStyleSheetStyle::styleSheetPalette
                  ((QStyleSheetStyle *)this_03,(QWidget *)this,&opt_1,&opt_1.palette);
      }
      if (this_02->control == (QWidgetTextControl *)0x0) {
        LVar7 = QLabelPrivate::textDirection(this_02);
        uVar18 = (uint)(LVar7 != LeftToRight) * 0x20000 + 0x20000 |
                 (uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i;
        if ((this_02->field_0x340 & 0x20) != 0) {
          iVar15 = (**(code **)(*(long *)object + 0xf0))(object,0x29,&opt_1,this,0);
          uVar18 = (uint)(iVar15 == 0) << 0xf | uVar18 | 0x800;
        }
        opt._0_16_ = QRectF::toRect(&local_108);
        uVar1 = ((this->super_QFrame).super_QWidget.data)->widget_attributes;
        CVar9 = QWidget::foregroundRole((QWidget *)this);
        (**(code **)(*(long *)object + 0x98))
                  (object,&painter,&opt,uVar18,&opt_1.palette,(uVar1 & 1) == 0,&this_02->text,CVar9)
        ;
      }
      else {
        iVar15 = (**(code **)(*(long *)object + 0xf0))(object,0x29,0,this,0);
        if (this_02->shortcutId != 0) {
          QTextCursor::charFormat();
          cVar6 = QTextCharFormat::fontUnderline();
          QTextFormat::~QTextFormat((QTextFormat *)&opt);
          if ((iVar15 != 0) != (bool)cVar6) {
            opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QTextCharFormat::QTextCharFormat((QTextCharFormat *)&opt);
            QTextCharFormat::setFontUnderline((QTextCharFormat *)&opt,iVar15 != 0);
            QTextCursor::mergeCharFormat((QTextCharFormat *)&this_02->shortcutCursor);
            QTextFormat::~QTextFormat((QTextFormat *)&opt);
          }
        }
        QLabelPrivate::ensureTextLayouted(this_02);
        puVar16 = &DAT_0065baf8;
        pPVar17 = (PaintContext *)&opt;
        for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
          *(undefined8 *)pPVar17 = *puVar16;
          puVar16 = puVar16 + (ulong)bVar23 * -2 + 1;
          pPVar17 = (PaintContext *)((long)pPVar17 + (ulong)bVar23 * -0x10 + 8);
        }
        QAbstractTextDocumentLayout::PaintContext::PaintContext((PaintContext *)&opt);
        this_01 = &opt.state;
        QPalette::operator=((QPalette *)this_01,&opt_1.palette);
        CVar9 = QWidget::foregroundRole((QWidget *)this);
        if ((CVar9 != Text) &&
           ((((this->super_QFrame).super_QWidget.data)->widget_attributes & 1) == 0)) {
          CVar9 = QWidget::foregroundRole((QWidget *)this);
          acolor = QPalette::color((QPalette *)this_01,CVar9);
          QPalette::setColor((QPalette *)this_01,Text,acolor);
        }
        QPainter::save();
        local_128 = (undefined1  [8])QVar12;
        puStack_120 = puVar3;
        QPainter::translate((QPointF *)&painter);
        local_128 = (undefined1  [8])((double)QVar12 - (double)QVar12);
        puStack_120 = (undefined1 *)((double)puVar3 - (double)puVar3);
        local_118 = puVar4;
        qStack_110 = dVar24;
        QPainter::setClipRect((QRectF *)&painter,(ClipOperation)local_128);
        QWidgetTextControl::setPalette((QWidgetTextControl *)this_02->control,(QPalette *)this_01);
        local_118 = (undefined1 *)0x0;
        qStack_110 = 0.0;
        local_128._0_4_ = 0;
        local_128._4_4_ = 0;
        puStack_120 = (undefined1 *)0x0;
        QWidgetTextControl::drawContents
                  ((QWidgetTextControl *)this_02->control,&painter,(QRectF *)local_128,
                   (QWidget *)this);
        QPainter::restore();
        QAbstractTextDocumentLayout::PaintContext::~PaintContext((PaintContext *)&opt);
      }
      QStyleOption::~QStyleOption(&opt_1);
      goto LAB_003e5338;
    }
    if ((this_02->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
        super__Optional_payload<QPicture,_true,_false,_false>.super__Optional_payload_base<QPicture>
        ._M_engaged == true) {
      this_00 = &this_02->picture;
      std::_Optional_base_impl<QPicture,_std::_Optional_base<QPicture,_false,_false>_>::_M_get
                ((_Optional_base_impl<QPicture,_std::_Optional_base<QPicture,_false,_false>_> *)
                 this_00);
      auVar26 = QPicture::boundingRect();
      iVar22 = auVar26._0_4_;
      iVar15 = (auVar26._8_4_ - iVar22) + 1;
      iVar21 = auVar26._4_4_;
      iVar19 = (auVar26._12_4_ - iVar21) + 1;
      if ((this_02->field_0x340 & 2) == 0) {
        if ((char)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i < '\0') {
          iVar20 = ((local_d4 - (iVar19 + local_dc)) + 1) / 2;
        }
        else {
          iVar20 = 0;
          if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                     super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x40) != 0) {
            iVar20 = (local_d4 - (iVar19 + local_dc)) + 1;
          }
        }
        if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                   super_QFlagsStorage<Qt::AlignmentFlag>.i & 2) == 0) {
          iVar19 = 0;
          if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                     super_QFlagsStorage<Qt::AlignmentFlag>.i & 4) != 0) {
            iVar19 = ((local_d8 - (iVar15 + local_e0)) + 1) / 2;
          }
        }
        else {
          iVar19 = (local_d8 - (iVar15 + local_e0)) + 1;
        }
        iVar15 = (iVar19 - iVar22) + local_e0;
        iVar21 = (iVar20 - iVar21) + local_dc;
        pQVar10 = std::_Optional_base_impl<QPicture,_std::_Optional_base<QPicture,_false,_false>_>::
                  _M_get((_Optional_base_impl<QPicture,_std::_Optional_base<QPicture,_false,_false>_>
                          *)this_00);
        QPainter::drawPicture(&painter,iVar15,iVar21,pQVar10);
      }
      else {
        QPainter::save();
        QPainter::translate(&painter,(double)local_e0,(double)local_dc);
        QPainter::scale((double)((local_d8 - local_e0) + 1) / (double)iVar15,
                        (double)((local_d4 - local_dc) + 1) / (double)iVar19);
        pQVar10 = std::_Optional_base_impl<QPicture,_std::_Optional_base<QPicture,_false,_false>_>::
                  _M_get((_Optional_base_impl<QPicture,_std::_Optional_base<QPicture,_false,_false>_>
                          *)this_00);
        QPainter::drawPicture(&painter,-iVar22,-iVar21,pQVar10);
        QPainter::restore();
      }
      goto LAB_003e5338;
    }
    if ((this_02->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
        super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
        _M_engaged != true) goto LAB_003e5338;
    std::_Optional_base_impl<QIcon,_std::_Optional_base<QIcon,_false,_false>_>::_M_get
              ((_Optional_base_impl<QIcon,_std::_Optional_base<QIcon,_false,_false>_> *)
               &this_02->icon);
    cVar6 = QIcon::isNull();
    if (cVar6 != '\0') goto LAB_003e5338;
    dVar24 = (double)QPaintDevice::devicePixelRatio();
    if ((this_02->field_0x340 & 2) == 0) {
      local_128 = *(undefined1 (*) [8])&this_02->pixmapSize;
    }
    else {
      local_128._0_4_ = (local_d8 - local_e0) + 1;
      local_128._4_4_ = (local_d4 - local_dc) + 1;
    }
    uVar1 = ((this->super_QFrame).super_QWidget.data)->widget_attributes;
    opt_1.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt_1._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt_1._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar11 = std::_Optional_base_impl<QIcon,_std::_Optional_base<QIcon,_false,_false>_>::_M_get
                        ((_Optional_base_impl<QIcon,_std::_Optional_base<QIcon,_false,_false>_> *)
                         &this_02->icon);
    QIcon::pixmap((QSize *)&opt_1,dVar24,(Mode)pQVar11,(State)local_128);
    if ((this_02->field_0x340 & 2) != 0) {
      QVar12 = (QSize)QPixmap::size();
      QVar13 = operator*((QSize *)local_128,dVar24);
      if (QVar12 != QVar13) {
        local_108.w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_108.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_108.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        opt.rect._0_8_ = QPixmap::cacheKey();
        opt._8_8_ = "qt_label_";
        opt.version = 9;
        opt.type = 0;
        opt.rect._8_8_ = CONCAT71(opt.rect._9_7_,(char)uVar1) & 0xffffffffffffff01;
        opt._32_4_ = local_128._0_4_;
        opt.palette.d = (QPalettePrivate *)CONCAT44(opt.palette.d._4_4_,local_128._4_4_);
        opt.palette.currentGroup._0_2_ =
             (short)(int)((double)((ulong)(dVar24 * 1000.0) & 0x8000000000000000 |
                                  (ulong)DAT_005e55c0) + dVar24 * 1000.0);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
        ::convertTo<QString>
                  ((QString *)&local_108,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
                    *)&opt);
        cVar6 = QPixmapCache::find((QString *)&local_108,(QPixmap *)&opt_1);
        if (cVar6 == '\0') {
          local_130 = operator*((QSize *)local_128,dVar24);
          QPixmap::scaled((QSize *)&opt,(AspectRatioMode)&opt_1,(TransformationMode)&local_130);
          QPixmap::operator=((QPixmap *)&opt_1,(QPixmap *)&opt);
          QPixmap::~QPixmap((QPixmap *)&opt);
          QPixmap::setDevicePixelRatio(dVar24);
          QPixmapCache::insert((QString *)&local_108,(QPixmap *)&opt_1);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
      }
    }
    opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption(&opt,1,0);
    QStyleOption::initFrom(&opt,(QWidget *)this);
    this_04 = &opt_1;
    (**(code **)(*(long *)object + 0xa0))
              (object,&painter,&local_e0,
               AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i,this_04);
    QStyleOption::~QStyleOption(&opt);
  }
  QPixmap::~QPixmap((QPixmap *)this_04);
LAB_003e5338:
  QPainter::~QPainter(&painter);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::paintEvent(QPaintEvent *)
{
    Q_D(QLabel);
    QStyle *style = QWidget::style();
    QPainter painter(this);
    drawFrame(&painter);
    QRect cr = contentsRect();
    cr.adjust(d->margin, d->margin, -d->margin, -d->margin);
    int align = QStyle::visualAlignment(d->isTextLabel ? d->textDirection()
                                                       : layoutDirection(), QFlag(d->align));

#if QT_CONFIG(movie)
    if (d->movie && !d->movie->currentPixmap().isNull()) {
        if (d->scaledcontents)
            style->drawItemPixmap(&painter, cr, align, d->movie->currentPixmap().scaled(cr.size()));
        else
            style->drawItemPixmap(&painter, cr, align, d->movie->currentPixmap());
    }
    else
#endif
    if (d->isTextLabel) {
        QRectF lr = d->layoutRect().toAlignedRect();
        QStyleOption opt;
        opt.initFrom(this);
#ifndef QT_NO_STYLE_STYLESHEET
        if (QStyleSheetStyle* cssStyle = qt_styleSheet(style))
            cssStyle->styleSheetPalette(this, &opt, &opt.palette);
#endif
        if (d->control) {
#ifndef QT_NO_SHORTCUT
            const bool underline = static_cast<bool>(style->styleHint(QStyle::SH_UnderlineShortcut,
                                                                      nullptr, this, nullptr));
            if (d->shortcutId != 0
                && underline != d->shortcutCursor.charFormat().fontUnderline()) {
                QTextCharFormat fmt;
                fmt.setFontUnderline(underline);
                d->shortcutCursor.mergeCharFormat(fmt);
            }
#endif
            d->ensureTextLayouted();

            QAbstractTextDocumentLayout::PaintContext context;
            // Adjust the palette
            context.palette = opt.palette;

            if (foregroundRole() != QPalette::Text && isEnabled())
                context.palette.setColor(QPalette::Text, context.palette.color(foregroundRole()));

            painter.save();
            painter.translate(lr.topLeft());
            painter.setClipRect(lr.translated(-lr.x(), -lr.y()));
            d->control->setPalette(context.palette);
            d->control->drawContents(&painter, QRectF(), this);
            painter.restore();
        } else {
            int flags = align | (d->textDirection() == Qt::LeftToRight ? Qt::TextForceLeftToRight
                                                                       : Qt::TextForceRightToLeft);
            if (d->hasShortcut) {
                flags |= Qt::TextShowMnemonic;
                if (!style->styleHint(QStyle::SH_UnderlineShortcut, &opt, this))
                    flags |= Qt::TextHideMnemonic;
            }
            style->drawItemText(&painter, lr.toRect(), flags, opt.palette, isEnabled(), d->text, foregroundRole());
        }
    } else
#ifndef QT_NO_PICTURE
    if (d->picture) {
        QRect br = d->picture->boundingRect();
        int rw = br.width();
        int rh = br.height();
        if (d->scaledcontents) {
            painter.save();
            painter.translate(cr.x(), cr.y());
            painter.scale((double)cr.width()/rw, (double)cr.height()/rh);
            painter.drawPicture(-br.x(), -br.y(), *d->picture);
            painter.restore();
        } else {
            int xo = 0;
            int yo = 0;
            if (align & Qt::AlignVCenter)
                yo = (cr.height()-rh)/2;
            else if (align & Qt::AlignBottom)
                yo = cr.height()-rh;
            if (align & Qt::AlignRight)
                xo = cr.width()-rw;
            else if (align & Qt::AlignHCenter)
                xo = (cr.width()-rw)/2;
            painter.drawPicture(cr.x()+xo-br.x(), cr.y()+yo-br.y(), *d->picture);
        }
    } else
#endif
    if (d->icon && !d->icon->isNull()) {
        const qreal dpr = devicePixelRatio();
        const QSize size = d->scaledcontents ? cr.size() : d->pixmapSize;
        const auto mode = isEnabled() ? QIcon::Normal : QIcon::Disabled;
        QPixmap pix = d->icon->pixmap(size, dpr, mode);
        if (d->scaledcontents && pix.size() != size * dpr) {
            const QString key = "qt_label_"_L1 % HexString<quint64>(pix.cacheKey())
                                               % HexString<quint8>(mode)
                                               % HexString<uint>(size.width())
                                               % HexString<uint>(size.height())
                                               % HexString<quint16>(qRound(dpr * 1000));
            if (!QPixmapCache::find(key, &pix)) {
                pix = pix.scaled(size * dpr, Qt::IgnoreAspectRatio, Qt::SmoothTransformation);
                pix.setDevicePixelRatio(dpr);
                // using QIcon to cache the newly create pixmap is not possible
                // because QIcon does not clear this cache (so we grow indefinitely)
                // and also uses the newly added pixmap as starting point for new
                // scaled pixmap which makes it very blurry.
                // Therefore use QPixmapCache here.
                QPixmapCache::insert(key, pix);
            }
        }
        QStyleOption opt;
        opt.initFrom(this);
        style->drawItemPixmap(&painter, cr, align, pix);
    }
}